

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O1

int libpd_aftertouch(int channel,int value)

{
  int iVar1;
  
  iVar1 = -1;
  if ((uint)value < 0x80 && -1 < channel) {
    sys_lock();
    inmidi_aftertouch((uint)channel >> 4,channel & 0xf,value);
    sys_unlock();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int libpd_aftertouch(int channel, int value) {
  CHECK_CHANNEL
  CHECK_RANGE_7BIT(value)
  sys_lock();
  inmidi_aftertouch(PORT, CHANNEL, value);
  sys_unlock();
  return 0;
}